

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

int satoko_solve_assumptions_limit(satoko_t *s,int *plits,int nlits,int nconflim)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = (s->opts).conf_limit;
  if (nconflim == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)nconflim + (s->stats).n_conflicts;
  }
  (s->opts).conf_limit = lVar3;
  iVar2 = satoko_solve_assumptions(s,plits,nlits);
  (s->opts).conf_limit = (long)(int)lVar1;
  return iVar2;
}

Assistant:

int satoko_solve_assumptions_limit(satoko_t *s, int * plits, int nlits, int nconflim)
{
    int temp = s->opts.conf_limit, status;
    s->opts.conf_limit = nconflim ? s->stats.n_conflicts + nconflim : 0;
    status = satoko_solve_assumptions(s, plits, nlits);
    s->opts.conf_limit = temp;
    return status;
}